

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall
smf::MidiMessage::makeTemperamentEqual(MidiMessage *this,int referencePitchClass,int channelMask)

{
  allocator_type local_41;
  value_type_conflict3 local_40;
  vector<double,_std::allocator<double>_> temperament;
  
  local_40 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&temperament,0xc,&local_40,&local_41);
  makeMts9_TemperamentByCentsDeviationFromET(this,&temperament,referencePitchClass,channelMask);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&temperament.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void MidiMessage::makeTemperamentEqual(int referencePitchClass, int channelMask) {
	std::vector<double> temperament(12, 0.0);
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}